

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendFuncCase::iterate(BlendFuncCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  GLenum err;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  int local_3d0;
  int local_3cc;
  int ndx_31;
  int ndx_30;
  int ndx_29;
  int ndx_28;
  int ndx_27;
  allocator<char> local_391;
  string local_390;
  ScopedLogSection local_370;
  ScopedLogSection section_6;
  int ndx_26;
  int ndx_25;
  int ndx_24;
  int ndx_23;
  int ndx_22;
  allocator<char> local_329;
  string local_328;
  ScopedLogSection local_308;
  ScopedLogSection section_5;
  int ndx_21;
  int ndx_20;
  int ndx_19;
  int ndx_18;
  int ndx_17;
  allocator<char> local_2c1;
  string local_2c0;
  ScopedLogSection local_2a0;
  ScopedLogSection section_4;
  int ndx_16;
  int ndx_15;
  int ndx_14;
  int ndx_13;
  int ndx_12;
  allocator<char> local_259;
  string local_258;
  ScopedLogSection local_238;
  ScopedLogSection section_3;
  int local_228;
  int ndx_11;
  int ndx_10;
  int ndx_9;
  int ndx_8;
  allocator<char> local_1f1;
  string local_1f0;
  ScopedLogSection local_1d0;
  ScopedLogSection section_2;
  int local_1c0;
  int ndx_7;
  int ndx_6;
  int ndx_5;
  int ndx_4;
  allocator<char> local_189;
  string local_188;
  ScopedLogSection local_168;
  ScopedLogSection section_1;
  int local_158;
  int ndx_3;
  int ndx_2;
  int ndx_1;
  int ndx;
  allocator<char> local_121;
  string local_120;
  ScopedLogSection local_100;
  ScopedLogSection section;
  deInt32 maxDrawBuffers;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  ResultCollector result;
  CallLogWrapper gl;
  deUint32 blendFuncs [15];
  BlendFuncCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar5);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0," // ERROR: ",&local_e1);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_c0,pTVar5,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  section.m_log._0_4_ = 0;
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8824,(GLint *)&section);
  err = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x428);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Initial",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Initial value",(allocator<char> *)((long)&ndx_1 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_100,pTVar5,&local_120,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_1 + 3));
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  for (ndx_2 = 0; ndx_2 < (int)section.m_log; ndx_2 = ndx_2 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c9,ndx_2,1,this->m_verifierType);
  }
  for (ndx_3 = 0; ndx_3 < (int)section.m_log; ndx_3 = ndx_3 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c8,ndx_3,0,this->m_verifierType);
  }
  for (local_158 = 0; local_158 < (int)section.m_log; local_158 = local_158 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80cb,local_158,1,this->m_verifierType);
  }
  for (section_1.m_log._4_4_ = 0; section_1.m_log._4_4_ < (int)section.m_log;
      section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80ca,section_1.m_log._4_4_,0,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_100);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"AfterSettingCommon",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_4,"After setting common",(allocator<char> *)((long)&ndx_5 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_168,pTVar5,&local_188,(string *)&ndx_4);
  std::__cxx11::string::~string((string *)&ndx_4);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_5 + 3));
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator(&local_189);
  glu::CallLogWrapper::glBlendFunc
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x302,0x304);
  for (ndx_6 = 0; ndx_6 < (int)section.m_log; ndx_6 = ndx_6 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c9,ndx_6,0x302,this->m_verifierType);
  }
  for (ndx_7 = 0; ndx_7 < (int)section.m_log; ndx_7 = ndx_7 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c8,ndx_7,0x304,this->m_verifierType);
  }
  for (local_1c0 = 0; local_1c0 < (int)section.m_log; local_1c0 = local_1c0 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80cb,local_1c0,0x302,this->m_verifierType);
  }
  for (section_2.m_log._4_4_ = 0; section_2.m_log._4_4_ < (int)section.m_log;
      section_2.m_log._4_4_ = section_2.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80ca,section_2.m_log._4_4_,0x304,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_168);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"AfterSettingCommonSeparate",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_8,"After setting common separate",(allocator<char> *)((long)&ndx_9 + 3))
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d0,pTVar5,&local_1f0,(string *)&ndx_8);
  std::__cxx11::string::~string((string *)&ndx_8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_9 + 3));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  glu::CallLogWrapper::glBlendFuncSeparate
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x300,0x303,0x306,0x305);
  for (ndx_10 = 0; ndx_10 < (int)section.m_log; ndx_10 = ndx_10 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c9,ndx_10,0x300,this->m_verifierType);
  }
  for (ndx_11 = 0; ndx_11 < (int)section.m_log; ndx_11 = ndx_11 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c8,ndx_11,0x303,this->m_verifierType);
  }
  for (local_228 = 0; local_228 < (int)section.m_log; local_228 = local_228 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80cb,local_228,0x306,this->m_verifierType);
  }
  for (section_3.m_log._4_4_ = 0; section_3.m_log._4_4_ < (int)section.m_log;
      section_3.m_log._4_4_ = section_3.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80ca,section_3.m_log._4_4_,0x305,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_1d0);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"AfterSettingIndexed",&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_12,"After setting indexed",(allocator<char> *)((long)&ndx_13 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_238,pTVar5,&local_258,(string *)&ndx_12);
  std::__cxx11::string::~string((string *)&ndx_12);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_13 + 3));
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  for (ndx_14 = 0; ndx_14 < (int)section.m_log; ndx_14 = ndx_14 + 1) {
    iVar3 = (int)((ulong)((long)(ndx_14 + 1) * -0x77777777) >> 0x20) + 1 + ndx_14;
    glu::CallLogWrapper::glBlendFunci
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_14,
               blendFuncs[(long)(ndx_14 % 0xf) + -2],
               blendFuncs[(long)(ndx_14 + 1 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2]);
  }
  for (ndx_15 = 0; ndx_15 < (int)section.m_log; ndx_15 = ndx_15 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c9,ndx_15,blendFuncs[(long)(ndx_15 % 0xf) + -2],this->m_verifierType);
  }
  for (ndx_16 = 0; ndx_16 < (int)section.m_log; ndx_16 = ndx_16 + 1) {
    iVar3 = (int)((ulong)((long)(ndx_16 + 1) * -0x77777777) >> 0x20) + 1 + ndx_16;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c8,ndx_16,
               blendFuncs[(long)(ndx_16 + 1 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2],
               this->m_verifierType);
  }
  for (section_4.m_log._4_4_ = 0; section_4.m_log._4_4_ < (int)section.m_log;
      section_4.m_log._4_4_ = section_4.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80cb,section_4.m_log._4_4_,blendFuncs[(long)(section_4.m_log._4_4_ % 0xf) + -2],
               this->m_verifierType);
  }
  for (section_4.m_log._0_4_ = 0; (int)section_4.m_log < (int)section.m_log;
      section_4.m_log._0_4_ = (int)section_4.m_log + 1) {
    iVar3 = (int)((ulong)((long)((int)section_4.m_log + 1) * -0x77777777) >> 0x20) + 1 +
            (int)section_4.m_log;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80ca,(int)section_4.m_log,
               blendFuncs
               [(long)((int)section_4.m_log + 1 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2],
               this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_238);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"AfterSettingIndexedSeparate",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_17,"After setting indexed separate",
             (allocator<char> *)((long)&ndx_18 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_2a0,pTVar5,&local_2c0,(string *)&ndx_17);
  std::__cxx11::string::~string((string *)&ndx_17);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_18 + 3));
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  for (ndx_19 = 0; ndx_19 < (int)section.m_log; ndx_19 = ndx_19 + 1) {
    iVar3 = (int)((ulong)((long)(ndx_19 + 3) * -0x77777777) >> 0x20) + 3 + ndx_19;
    iVar1 = (int)((ulong)((long)(ndx_19 + 2) * -0x77777777) >> 0x20) + 2 + ndx_19;
    iVar2 = (int)((ulong)((long)(ndx_19 + 1) * -0x77777777) >> 0x20) + 1 + ndx_19;
    glu::CallLogWrapper::glBlendFuncSeparatei
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_19,
               blendFuncs[(long)(ndx_19 + 3 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2],
               blendFuncs[(long)(ndx_19 + 2 + ((iVar1 >> 3) - (iVar1 >> 0x1f)) * -0xf) + -2],
               blendFuncs[(long)(ndx_19 + 1 + ((iVar2 >> 3) - (iVar2 >> 0x1f)) * -0xf) + -2],
               blendFuncs[(long)(ndx_19 % 0xf) + -2]);
  }
  for (ndx_20 = 0; ndx_20 < (int)section.m_log; ndx_20 = ndx_20 + 1) {
    iVar3 = (int)((ulong)((long)(ndx_20 + 3) * -0x77777777) >> 0x20) + 3 + ndx_20;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c9,ndx_20,
               blendFuncs[(long)(ndx_20 + 3 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2],
               this->m_verifierType);
  }
  for (ndx_21 = 0; ndx_21 < (int)section.m_log; ndx_21 = ndx_21 + 1) {
    iVar3 = (int)((ulong)((long)(ndx_21 + 2) * -0x77777777) >> 0x20) + 2 + ndx_21;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c8,ndx_21,
               blendFuncs[(long)(ndx_21 + 2 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2],
               this->m_verifierType);
  }
  for (section_5.m_log._4_4_ = 0; section_5.m_log._4_4_ < (int)section.m_log;
      section_5.m_log._4_4_ = section_5.m_log._4_4_ + 1) {
    iVar3 = (int)((ulong)((long)(section_5.m_log._4_4_ + 1) * -0x77777777) >> 0x20) + 1 +
            section_5.m_log._4_4_;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80cb,section_5.m_log._4_4_,
               blendFuncs
               [(long)(section_5.m_log._4_4_ + 1 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2],
               this->m_verifierType);
  }
  for (section_5.m_log._0_4_ = 0; (int)section_5.m_log < (int)section.m_log;
      section_5.m_log._0_4_ = (int)section_5.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80ca,(int)section_5.m_log,blendFuncs[(long)((int)section_5.m_log % 0xf) + -2],
               this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_2a0);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"AfterResettingIndexedWithCommon",&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_22,"After resetting indexed with common",
             (allocator<char> *)((long)&ndx_23 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_308,pTVar5,&local_328,(string *)&ndx_22);
  std::__cxx11::string::~string((string *)&ndx_22);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_23 + 3));
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  for (ndx_24 = 0; ndx_24 < (int)section.m_log; ndx_24 = ndx_24 + 1) {
    iVar3 = (int)((ulong)((long)(ndx_24 + 1) * -0x77777777) >> 0x20) + 1 + ndx_24;
    glu::CallLogWrapper::glBlendFunci
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_24,
               blendFuncs[(long)(ndx_24 % 0xf) + -2],
               blendFuncs[(long)(ndx_24 + 1 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2]);
  }
  glu::CallLogWrapper::glBlendFunc
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x302,0x304);
  for (ndx_25 = 0; ndx_25 < (int)section.m_log; ndx_25 = ndx_25 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c9,ndx_25,0x302,this->m_verifierType);
  }
  for (ndx_26 = 0; ndx_26 < (int)section.m_log; ndx_26 = ndx_26 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c8,ndx_26,0x304,this->m_verifierType);
  }
  for (section_6.m_log._4_4_ = 0; section_6.m_log._4_4_ < (int)section.m_log;
      section_6.m_log._4_4_ = section_6.m_log._4_4_ + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80cb,section_6.m_log._4_4_,0x302,this->m_verifierType);
  }
  for (section_6.m_log._0_4_ = 0; (int)section_6.m_log < (int)section.m_log;
      section_6.m_log._0_4_ = (int)section_6.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80ca,(int)section_6.m_log,0x304,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_308);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"AfterResettingIndexedWithCommonSeparate",&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx_27,"After resetting indexed with common separate",
             (allocator<char> *)((long)&ndx_28 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_370,pTVar5,&local_390,(string *)&ndx_27);
  std::__cxx11::string::~string((string *)&ndx_27);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ndx_28 + 3));
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  glu::CallLogWrapper::glBlendFuncSeparate
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x300,0x303,0x306,0x305);
  for (ndx_29 = 0; ndx_29 < (int)section.m_log; ndx_29 = ndx_29 + 1) {
    iVar3 = (int)((ulong)((long)(ndx_29 + 3) * -0x77777777) >> 0x20) + 3 + ndx_29;
    iVar1 = (int)((ulong)((long)(ndx_29 + 2) * -0x77777777) >> 0x20) + 2 + ndx_29;
    iVar2 = (int)((ulong)((long)(ndx_29 + 1) * -0x77777777) >> 0x20) + 1 + ndx_29;
    glu::CallLogWrapper::glBlendFuncSeparatei
              ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),ndx_29,
               blendFuncs[(long)(ndx_29 + 3 + ((iVar3 >> 3) - (iVar3 >> 0x1f)) * -0xf) + -2],
               blendFuncs[(long)(ndx_29 + 2 + ((iVar1 >> 3) - (iVar1 >> 0x1f)) * -0xf) + -2],
               blendFuncs[(long)(ndx_29 + 1 + ((iVar2 >> 3) - (iVar2 >> 0x1f)) * -0xf) + -2],
               blendFuncs[(long)(ndx_29 % 0xf) + -2]);
  }
  glu::CallLogWrapper::glBlendFuncSeparate
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x300,0x303,0x306,0x305);
  for (ndx_30 = 0; ndx_30 < (int)section.m_log; ndx_30 = ndx_30 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c9,ndx_30,0x300,this->m_verifierType);
  }
  for (ndx_31 = 0; ndx_31 < (int)section.m_log; ndx_31 = ndx_31 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80c8,ndx_31,0x303,this->m_verifierType);
  }
  for (local_3cc = 0; local_3cc < (int)section.m_log; local_3cc = local_3cc + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80cb,local_3cc,0x306,this->m_verifierType);
  }
  for (local_3d0 = 0; local_3d0 < (int)section.m_log; local_3d0 = local_3d0 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              ((ResultCollector *)local_c0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x80ca,local_3d0,0x305,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_370);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_c0,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_c0);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

BlendFuncCase::IterateResult BlendFuncCase::iterate (void)
{
	const deUint32 blendFuncs[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_DST_COLOR,
		GL_ONE_MINUS_DST_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
		GL_DST_ALPHA,
		GL_ONE_MINUS_DST_ALPHA,
		GL_CONSTANT_COLOR,
		GL_ONE_MINUS_CONSTANT_COLOR,
		GL_CONSTANT_ALPHA,
		GL_ONE_MINUS_CONSTANT_ALPHA,
		GL_SRC_ALPHA_SATURATE
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_ONE, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ZERO, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_ONE, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ZERO, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_DST_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommonSeparate", "After setting common separate");

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ONE_MINUS_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_DST_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ONE_MINUS_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFunci(ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexedSeparate", "After setting indexed separate");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFuncSeparatei(ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)], m_verifierType);

	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFunci(ndx, blendFuncs[ndx % DE_LENGTH_OF_ARRAY(blendFuncs)], blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		gl.glBlendFunc(GL_SRC_ALPHA, GL_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_DST_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_DST_ALPHA, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommonSeparate", "After resetting indexed with common separate");

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendFuncSeparatei(ndx, blendFuncs[(ndx + 3) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 2) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendFuncs)],
										 blendFuncs[(ndx + 0) % DE_LENGTH_OF_ARRAY(blendFuncs)]);

		gl.glBlendFuncSeparate(GL_SRC_COLOR, GL_ONE_MINUS_SRC_ALPHA, GL_DST_COLOR, GL_ONE_MINUS_DST_ALPHA);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_RGB, ndx, GL_SRC_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_RGB, ndx, GL_ONE_MINUS_SRC_ALPHA, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_SRC_ALPHA, ndx, GL_DST_COLOR, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_DST_ALPHA, ndx, GL_ONE_MINUS_DST_ALPHA, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}